

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

InternalParseResult * __thiscall
Catch::clara::detail::ParserBase::parse
          (InternalParseResult *__return_storage_ptr__,ParserBase *this,Args *args)

{
  string local_60 [32];
  TokenStream local_40;
  
  ::std::__cxx11::string::string(local_60,(string *)args);
  TokenStream::TokenStream(&local_40,args);
  (*this->_vptr_ParserBase[3])(__return_storage_ptr__,this,local_60,&local_40);
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
            (&local_40.m_tokenBuffer);
  ::std::__cxx11::string::~string(local_60);
  return __return_storage_ptr__;
}

Assistant:

auto parse( Args const &args ) const -> InternalParseResult {
            return parse( args.exeName(), TokenStream( args ) );
        }